

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

lys_node * resolve_json_nodeid(char *nodeid,ly_ctx *ctx,lys_node *start)

{
  char cVar1;
  char *pcVar2;
  LY_ECODE code;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  lys_node_list *parent;
  lys_node_list *list;
  uint8_t *puVar6;
  lys_module *plVar7;
  lys_module *plVar8;
  lys_node *plVar9;
  lys_module *module;
  LY_ERR *pLVar10;
  undefined8 uVar11;
  size_t sVar12;
  lys_module *local_88;
  char *local_70;
  char *local_68;
  char *name;
  int local_58;
  int is_relative;
  int has_predicate;
  char *mod_name;
  int local_3c;
  uint local_38;
  int nam_len;
  int r;
  int mod_name_len;
  
  pcVar5 = ly_buf();
  name._4_4_ = -1;
  if ((nodeid == (char *)0x0) || (ctx == (ly_ctx *)0x0 && start == (lys_node *)0x0)) {
    __assert_fail("nodeid && (ctx || start)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x7d4,
                  "const struct lys_node *resolve_json_nodeid(const char *, struct ly_ctx *, const struct lys_node *)"
                 );
  }
  if (ctx == (ly_ctx *)0x0) {
    ctx = start->module->ctx;
  }
  uVar3 = parse_schema_nodeid(nodeid,(char **)&has_predicate,&nam_len,&local_68,&local_3c,
                              (int *)((long)&name + 4),&local_58);
  local_38 = uVar3;
  if (0 < (int)uVar3) {
    if (name._4_4_ == 0) {
      if (_has_predicate == (char *)0x0) {
        ly_vlog(LYE_PATH_MISSMOD,LY_VLOG_STR,nodeid);
        return (lys_node *)0x0;
      }
      if (0x3ff < nam_len) {
        pLVar10 = ly_errno_location();
        *pLVar10 = LY_EINT;
        uVar11 = 0x7ef;
LAB_00114c7a:
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
               ,uVar11);
        return (lys_node *)0x0;
      }
      puVar6 = ly_buf_used_location();
      if ((*puVar6 == '\0') || (*pcVar5 == '\0')) {
        mod_name = (char *)0x0;
      }
      else {
        mod_name = strndup(pcVar5,0x3ff);
      }
      puVar6 = ly_buf_used_location();
      *puVar6 = *puVar6 + '\x01';
      sVar12 = (size_t)nam_len;
      memmove(pcVar5,_has_predicate,sVar12);
      pcVar5[sVar12] = '\0';
      module = ly_ctx_get_module(ctx,pcVar5,(char *)0x0);
      pcVar2 = mod_name;
      if (mod_name != (char *)0x0) {
        strcpy(pcVar5,mod_name);
        free(pcVar2);
      }
      puVar6 = ly_buf_used_location();
      *puVar6 = *puVar6 + 0xff;
      if (module == (lys_module *)0x0) {
        pcVar5 = _has_predicate + ((long)nam_len - (long)nodeid);
LAB_00114c95:
        pcVar5 = strndup(nodeid,(size_t)pcVar5);
        code = LYE_PATH_INMOD;
LAB_00114b1a:
        ly_vlog(code,LY_VLOG_STR,pcVar5);
LAB_00114b28:
        free(pcVar5);
        return (lys_node *)0x0;
      }
      _has_predicate = (char *)0x0;
      nam_len = 0;
      parent = (lys_node_list *)0x0;
    }
    else {
      parent = (lys_node_list *)start;
      if (start == (lys_node *)0x0) {
        __assert_fail("start",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                      ,0x7e2,
                      "const struct lys_node *resolve_json_nodeid(const char *, struct ly_ctx *, const struct lys_node *)"
                     );
      }
      for (; (parent != (lys_node_list *)0x0 && (parent->nodetype == LYS_USES));
          parent = (lys_node_list *)lys_parent((lys_node *)parent)) {
      }
      module = start->module;
    }
    local_70 = nodeid + uVar3;
    is_relative = 0;
    local_88 = module;
    do {
      list = (lys_node_list *)0x0;
      do {
        do {
          do {
            list = (lys_node_list *)lys_getnext((lys_node *)list,(lys_node *)parent,module,0xb);
            if (list == (lys_node_list *)0x0) {
              pcVar5 = strndup(nodeid,(size_t)(local_68 + ((long)local_3c - (long)nodeid)));
              code = LYE_PATH_INNODE;
              goto LAB_00114b1a;
            }
            pcVar2 = list->name;
          } while (pcVar2 == (char *)0x0);
          sVar12 = (size_t)local_3c;
          iVar4 = strncmp(local_68,pcVar2,sVar12);
        } while ((iVar4 != 0) || (pcVar2[sVar12] != '\0'));
        plVar7 = local_88;
        if (_has_predicate != (char *)0x0) {
          if (0x3ff < nam_len) {
            pLVar10 = ly_errno_location();
            *pLVar10 = LY_EINT;
            uVar11 = 0x81c;
            goto LAB_00114c7a;
          }
          puVar6 = ly_buf_used_location();
          if (*puVar6 == '\0') {
            mod_name = (char *)0x0;
          }
          else if (*pcVar5 == '\0') {
            mod_name = (char *)0x0;
          }
          else {
            mod_name = strndup(pcVar5,0x3ff);
          }
          puVar6 = ly_buf_used_location();
          *puVar6 = *puVar6 + '\x01';
          sVar12 = (size_t)nam_len;
          memmove(pcVar5,_has_predicate,sVar12);
          pcVar5[sVar12] = '\0';
          plVar7 = ly_ctx_get_module(ctx,pcVar5,(char *)0x0);
          pcVar2 = mod_name;
          if (mod_name != (char *)0x0) {
            strncpy(pcVar5,mod_name,0x3ff);
            free(pcVar2);
          }
          puVar6 = ly_buf_used_location();
          *puVar6 = *puVar6 + 0xff;
          if (plVar7 == (lys_module *)0x0) {
            pcVar5 = _has_predicate + ((long)nam_len - (long)nodeid);
            goto LAB_00114c95;
          }
        }
        plVar8 = lys_node_module((lys_node *)list);
      } while (plVar7 != plVar8);
      if (local_58 != 0) {
        local_38 = 0;
        if ((list->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
          if (list->nodetype != LYS_LIST) {
            uVar3 = (uint)*local_70;
            goto LAB_00114b49;
          }
          iVar4 = resolve_json_schema_list_predicate(local_70,list,(int *)&local_38);
          if (iVar4 != 0) {
            return (lys_node *)0x0;
          }
        }
        else {
          local_38 = parse_schema_json_predicate
                               (local_70,(char **)0x0,(int *)0x0,(char **)0x0,(int *)0x0,&local_58);
          if ((int)local_38 < 1) goto LAB_00114ca7;
        }
        local_70 = local_70 + (int)local_38;
      }
      plVar9 = lys_parent((lys_node *)list);
      if ((plVar9 != (lys_node *)0x0) &&
         (plVar9 = lys_parent((lys_node *)list), plVar9->nodetype == LYS_CHOICE)) {
        is_relative = is_relative ^ -(uint)(list->nodetype != LYS_CASE);
      }
      uVar3 = (uint)*local_70;
      if (uVar3 == 0) {
        if (is_relative == 0) {
          return (lys_node *)list;
        }
        pcVar5 = strndup(nodeid,(size_t)(local_68 + ((long)local_3c - (long)nodeid)));
        ly_vlog(LYE_PATH_INNODE,LY_VLOG_STR,pcVar5);
        ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                "Schema shorthand case path must include the virtual case statement.");
        goto LAB_00114b28;
      }
      if (is_relative == 0) {
        if ((list->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)
        goto LAB_00114b49;
LAB_00114ab2:
        local_88 = list->child->module;
      }
      else {
        list = parent;
        if (parent != (lys_node_list *)0x0) goto LAB_00114ab2;
        list = (lys_node_list *)0x0;
        local_88 = module;
      }
      local_38 = parse_schema_nodeid(local_70,(char **)&has_predicate,&nam_len,&local_68,&local_3c,
                                     (int *)((long)&name + 4),&local_58);
      if ((int)local_38 < 1) goto LAB_00114ca7;
      local_70 = local_70 + local_38;
      parent = list;
    } while( true );
  }
  local_70 = nodeid + -uVar3;
  cVar1 = nodeid[-uVar3];
LAB_00114b3f:
  uVar3 = (uint)cVar1;
LAB_00114b49:
  ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)uVar3,local_70);
  return (lys_node *)0x0;
LAB_00114ca7:
  cVar1 = local_70[-local_38];
  local_70 = local_70 + -local_38;
  goto LAB_00114b3f;
}

Assistant:

const struct lys_node *
resolve_json_nodeid(const char *nodeid, struct ly_ctx *ctx, const struct lys_node *start)
{
    char *module_name = ly_buf(), *buf_backup = NULL, *str;
    const char *name, *mod_name, *id;
    const struct lys_node *sibling, *start_parent;
    int r, nam_len, mod_name_len, is_relative = -1, has_predicate, shorthand = 0;
    /* resolved import module from the start module, it must match the next node-name-match sibling */
    const struct lys_module *prefix_mod, *module, *prev_mod;

    assert(nodeid && (ctx || start));
    if (!ctx) {
        ctx = start->module->ctx;
    }

    id = nodeid;

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate)) < 1) {
        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }
    id += r;

    if (is_relative) {
        assert(start);
        start_parent = start;
        while (start_parent && (start_parent->nodetype == LYS_USES)) {
            start_parent = lys_parent(start_parent);
        }
        module = start->module;
    } else {
        if (!mod_name) {
            str = strndup(nodeid, (name + nam_len) - nodeid);
            LOGVAL(LYE_PATH_MISSMOD, LY_VLOG_STR, nodeid);
            free(str);
            return NULL;
        } else if (mod_name_len > LY_BUF_SIZE - 1) {
            LOGINT;
            return NULL;
        }

        if (ly_buf_used && module_name[0]) {
            buf_backup = strndup(module_name, LY_BUF_SIZE - 1);
        }
        ly_buf_used++;

        memmove(module_name, mod_name, mod_name_len);
        module_name[mod_name_len] = '\0';
        module = ly_ctx_get_module(ctx, module_name, NULL);

        if (buf_backup) {
            /* return previous internal buffer content */
            strcpy(module_name, buf_backup);
            free(buf_backup);
            buf_backup = NULL;
        }
        ly_buf_used--;

        if (!module) {
            str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
            LOGVAL(LYE_PATH_INMOD, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }
        start_parent = NULL;

        /* now it's as if there was no module name */
        mod_name = NULL;
        mod_name_len = 0;
    }

    prev_mod = module;

    while (1) {
        sibling = NULL;
        while ((sibling = lys_getnext(sibling, start_parent, module,
                LYS_GETNEXT_WITHCHOICE | LYS_GETNEXT_WITHCASE | LYS_GETNEXT_WITHINOUT))) {
            /* name match */
            if (sibling->name && !strncmp(name, sibling->name, nam_len) && !sibling->name[nam_len]) {
                /* module check */
                if (mod_name) {
                    if (mod_name_len > LY_BUF_SIZE - 1) {
                        LOGINT;
                        return NULL;
                    }

                    if (ly_buf_used && module_name[0]) {
                        buf_backup = strndup(module_name, LY_BUF_SIZE - 1);
                    }
                    ly_buf_used++;

                    memmove(module_name, mod_name, mod_name_len);
                    module_name[mod_name_len] = '\0';
                    /* will also find an augment module */
                    prefix_mod = ly_ctx_get_module(ctx, module_name, NULL);

                    if (buf_backup) {
                        /* return previous internal buffer content */
                        strncpy(module_name, buf_backup, LY_BUF_SIZE - 1);
                        free(buf_backup);
                        buf_backup = NULL;
                    }
                    ly_buf_used--;

                    if (!prefix_mod) {
                        str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
                        LOGVAL(LYE_PATH_INMOD, LY_VLOG_STR, str);
                        free(str);
                        return NULL;
                    }
                } else {
                    prefix_mod = prev_mod;
                }
                if (prefix_mod != lys_node_module(sibling)) {
                    continue;
                }

                /* do we have some predicates on it? */
                if (has_predicate) {
                    r = 0;
                    if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                        if ((r = parse_schema_json_predicate(id, NULL, NULL, NULL, NULL, &has_predicate)) < 1) {
                            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
                            return NULL;
                        }
                    } else if (sibling->nodetype == LYS_LIST) {
                        if (resolve_json_schema_list_predicate(id, (const struct lys_node_list *)sibling, &r)) {
                            return NULL;
                        }
                    } else {
                        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                        return NULL;
                    }
                    id += r;
                }

                /* check for shorthand cases - then 'start_parent' does not change */
                if (lys_parent(sibling) && (lys_parent(sibling)->nodetype == LYS_CHOICE) && (sibling->nodetype != LYS_CASE)) {
                    shorthand = ~shorthand;
                }

                /* the result node? */
                if (!id[0]) {
                    if (shorthand) {
                        /* wrong path for shorthand */
                        str = strndup(nodeid, (name + nam_len) - nodeid);
                        LOGVAL(LYE_PATH_INNODE, LY_VLOG_STR, str);
                        LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "Schema shorthand case path must include the virtual case statement.");
                        free(str);
                        return NULL;
                    }
                    return sibling;
                }

                if (!shorthand) {
                    /* move down the tree, if possible */
                    if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                        return NULL;
                    }
                    start_parent = sibling;
                }

                /* update prev mod */
                prev_mod = (start_parent ? start_parent->child->module : module);
                break;
            }
        }

        /* no match */
        if (!sibling) {
            str = strndup(nodeid, (name + nam_len) - nodeid);
            LOGVAL(LYE_PATH_INNODE, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }

        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate)) < 1) {
            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            return NULL;
        }
        id += r;
    }

    /* cannot get here */
    LOGINT;
    return NULL;
}